

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioApi.c
# Opt level: O0

float Mio_GateReadPinDelay(Mio_Gate_t *pGate,int iPin)

{
  int local_2c;
  Mio_Pin_t *pMStack_28;
  int i;
  Mio_Pin_t *pPin;
  int iPin_local;
  Mio_Gate_t *pGate_local;
  
  local_2c = 0;
  pMStack_28 = Mio_GateReadPins(pGate);
  while( true ) {
    if (pMStack_28 == (Mio_Pin_t *)0x0) {
      return 1e+09;
    }
    if (local_2c == iPin) break;
    pMStack_28 = Mio_PinReadNext(pMStack_28);
    local_2c = local_2c + 1;
  }
  return (float)(pMStack_28->dDelayBlockRise * 0.5 + pMStack_28->dDelayBlockFall * 0.5);
}

Assistant:

float Mio_GateReadPinDelay( Mio_Gate_t * pGate, int iPin )
{
    Mio_Pin_t * pPin;
    int i = 0;
    Mio_GateForEachPin( pGate, pPin )
        if ( i++ == iPin )
            return 0.5 * pPin->dDelayBlockRise + 0.5 * pPin->dDelayBlockFall;
    return ABC_INFINITY;
}